

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_wrapper.h
# Opt level: O2

double L18_4::use_f<double,std::function<double(double)>>(double v,function<double_(double)> *f)

{
  use_f<double,_std::function<double_(double)>_>::count =
       use_f<double,_std::function<double_(double)>_>::count + 1;
  std::operator<<((ostream *)&std::cout," use_f count = ");
}

Assistant:

T use_f(T v, F f) {
        static int count = 0;
        count ++;
        std::cout << " use_f count = " << count << ", &count = " << &count << std::endl;
        return f(v);
    }